

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nsh_history.c
# Opt level: O1

void nsh_history_add_entry(nsh_history_t *hist,char *entry)

{
  strncpy(hist->entries[hist->head],entry,0x80);
  hist->head = hist->head + 1 & 0xf;
  if (hist->size == 0x10) {
    hist->tail = hist->tail + 1 & 0xf;
  }
  else {
    hist->size = hist->size + 1;
  }
  return;
}

Assistant:

void nsh_history_add_entry(nsh_history_t* hist, const char* entry)
{
    strncpy(hist->entries[hist->head], entry, sizeof(hist->entries[hist->head]));

    hist->head = (hist->head + 1) % NSH_CMD_HISTORY_SIZE;

    if (nsh_history_is_full(hist)) {
        hist->tail = (hist->tail + 1) % NSH_CMD_HISTORY_SIZE;
    } else {
        hist->size++;
    }
}